

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::AccessChainTraverser::visitBinary
          (AccessChainTraverser *this,TVisit param_1,TIntermBinary *binary)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  undefined4 extraout_var;
  TType *this_00;
  TTypeList *pTVar4;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  ulong uVar7;
  TString *pTVar8;
  int index;
  long lVar9;
  undefined4 in_register_00000034;
  long lVar10;
  TString memberName;
  
  TVar3 = (binary->super_TIntermOperator).op;
  if (TVar3 == EOpIndexDirectStruct) {
    iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(binary,CONCAT44(in_register_00000034,param_1));
    this_00 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf0))
                                 ((long *)CONCAT44(extraout_var,iVar2));
    pTVar4 = TType::getStruct(this_00);
    iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(binary);
    lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*((pTVar4->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[**(int **)(*(long *)(lVar5 + 0xc0) + 8)].
              type)->_vptr_TType[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&memberName,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_01,iVar2));
    pTVar8 = &this->path;
    bVar1 = std::operator!=(pTVar8,"");
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,".");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (pTVar8,&memberName);
    TVar3 = (binary->super_TIntermOperator).op;
  }
  if (TVar3 == EOpIndexDirect) {
    iVar2 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(binary);
    uVar7 = *(ulong *)CONCAT44(extraout_var_02,iVar2);
    lVar5 = (**(code **)(uVar7 + 0x28))((ulong *)CONCAT44(extraout_var_02,iVar2));
    pTVar8 = &this->path;
    lVar10 = 0;
    lVar9 = 0;
    while( true ) {
      lVar6 = *(long *)(lVar5 + 0xc0);
      if (lVar6 == 0) {
        lVar6 = 0;
      }
      else {
        uVar7 = (ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 4;
        lVar6 = (long)(int)uVar7;
      }
      if (lVar6 <= lVar9) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,"[");
      String_abi_cxx11_(&memberName,
                        (glslang *)(ulong)*(uint *)(*(long *)(*(long *)(lVar5 + 0xc0) + 8) + lVar10)
                        ,10,(int)uVar7);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,&memberName);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pTVar8,"]");
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x10;
    }
  }
  return true;
}

Assistant:

bool visitBinary(TVisit, TIntermBinary* binary) override {
        if (binary->getOp() == EOpIndexDirectStruct)
        {
            const TTypeList& members = *binary->getLeft()->getType().getStruct();
            const TTypeLoc& member =
                members[binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst()];
            TString memberName = member.type->getFieldName();

            if (path != "")
                path.append(".");

            path.append(memberName);
        }

        if (binary->getOp() == EOpIndexDirect)
        {
            const TConstUnionArray& indices = binary->getRight()->getAsConstantUnion()->getConstArray();
            for (int index = 0; index < indices.size(); ++index)
            {
                path.append("[");
                path.append(String(indices[index].getIConst()));
                path.append("]");
            }
        }

        return true;
    }